

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void __thiscall rlist::_free(rlist *this,void *__ptr)

{
  long lVar1;
  long *plVar2;
  
  lVar1 = *__ptr;
  plVar2 = *(long **)((long)__ptr + 8);
  *(long **)(lVar1 + 8) = plVar2;
  *plVar2 = lVar1;
  operator_delete(__ptr);
  return;
}

Assistant:

void rlist::_free(void *ptr){
    ((listNode *)ptr)->prev->next=((listNode *)ptr)->next;
    ((listNode *)ptr)->next->prev=((listNode *)ptr)->prev;
    ((listNode *)ptr)->next=nullptr;   
    ((listNode *)ptr)->prev=nullptr;   
    delete (listNode *)ptr;
}